

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

FlagValue * __thiscall gflags::anon_unknown_2::FlagValue::New(FlagValue *this)

{
  int8 iVar1;
  FlagValue *pFVar2;
  undefined8 *puVar3;
  
  iVar1 = this->type_;
  switch(iVar1) {
  case '\0':
    pFVar2 = (FlagValue *)operator_new(0x10);
    puVar3 = (undefined8 *)operator_new(1);
    *(undefined1 *)puVar3 = 0;
    goto LAB_0013fe83;
  case '\x01':
    pFVar2 = (FlagValue *)operator_new(0x10);
    puVar3 = (undefined8 *)operator_new(4);
    goto LAB_0013fe2e;
  case '\x02':
    pFVar2 = (FlagValue *)operator_new(0x10);
    puVar3 = (undefined8 *)operator_new(4);
LAB_0013fe2e:
    *(undefined4 *)puVar3 = 0;
    goto LAB_0013fe83;
  case '\x03':
    pFVar2 = (FlagValue *)operator_new(0x10);
    puVar3 = (undefined8 *)operator_new(8);
    break;
  case '\x04':
    pFVar2 = (FlagValue *)operator_new(0x10);
    puVar3 = (undefined8 *)operator_new(8);
    break;
  case '\x05':
    pFVar2 = (FlagValue *)operator_new(0x10);
    puVar3 = (undefined8 *)operator_new(8);
    break;
  case '\x06':
    pFVar2 = (FlagValue *)operator_new(0x10);
    puVar3 = (undefined8 *)operator_new(0x20);
    *puVar3 = puVar3 + 2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    goto LAB_0013fe83;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                  ,0x1d5,"FlagValue *gflags::(anonymous namespace)::FlagValue::New() const");
  }
  *puVar3 = 0;
LAB_0013fe83:
  pFVar2->value_buffer_ = puVar3;
  pFVar2->type_ = iVar1;
  pFVar2->owns_value_ = true;
  return pFVar2;
}

Assistant:

FlagValue* FlagValue::New() const {
  switch (type_) {
    case FV_BOOL:   return new FlagValue(new bool(false), true);
    case FV_INT32:  return new FlagValue(new int32(0), true);
    case FV_UINT32: return new FlagValue(new uint32(0), true);
    case FV_INT64:  return new FlagValue(new int64(0), true);
    case FV_UINT64: return new FlagValue(new uint64(0), true);
    case FV_DOUBLE: return new FlagValue(new double(0.0), true);
    case FV_STRING: return new FlagValue(new string, true);
    default: assert(false); return NULL;  // unknown type
  }
}